

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqcompiler.cpp
# Opt level: O0

void __thiscall SQCompiler::ForEachStatement(SQCompiler *this)

{
  long lVar1;
  SQInteger SVar2;
  SQFuncState *funcstate;
  SQCompiler *this_00;
  SQUnsignedInteger SVar3;
  SQUnsignedInteger SVar4;
  SQUnsignedInteger SVar5;
  SQUnsignedInteger SVar6;
  SQInteger SVar7;
  SQObjectValue this_01;
  long *in_RDI;
  SQObject SVar8;
  SQInteger oldouters;
  SQInteger __ncontinues__;
  SQInteger __nbreaks__;
  SQInteger foreachpos;
  SQInteger jmppos;
  SQInteger itrpos;
  SQInteger valuepos;
  SQInteger indexpos;
  SQInteger container;
  SQScope __oldscope__;
  SQObject valname;
  SQObject idxname;
  longlong *in_stack_fffffffffffffeb8;
  SQCompiler *in_stack_fffffffffffffec0;
  sqvector<long_long> *this_02;
  SQInteger in_stack_fffffffffffffec8;
  SQInteger in_stack_fffffffffffffed0;
  SQCompiler *this_03;
  SQInteger in_stack_fffffffffffffed8;
  SQFuncState *funcstate_00;
  SQInteger in_stack_fffffffffffffee0;
  SQInteger in_stack_fffffffffffffee8;
  long lVar9;
  SQOpcode _op;
  SQFuncState *in_stack_fffffffffffffef0;
  SQFuncState *this_04;
  SQChar *in_stack_ffffffffffffff00;
  SQFuncState *in_stack_ffffffffffffff08;
  SQFuncState *this_05;
  SQObject *in_stack_ffffffffffffff28;
  SQCompiler *pSVar10;
  SQFuncState *in_stack_ffffffffffffff30;
  SQInteger in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff6c;
  SQCompiler *this_06;
  undefined1 in_stack_ffffffffffffffcf;
  
  Lex(in_stack_fffffffffffffec0);
  SVar8 = Expect((SQCompiler *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                 in_stack_ffffffffffffff60);
  this_01 = SVar8._unVal;
  Expect((SQCompiler *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
         in_stack_ffffffffffffff60);
  if (*in_RDI == 0x2c) {
    Lex(in_stack_fffffffffffffec0);
    Expect((SQCompiler *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
           in_stack_ffffffffffffff60);
  }
  else {
    SQFuncState::CreateString(in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,(SQInteger)in_RDI)
    ;
  }
  Expect((SQCompiler *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
         in_stack_ffffffffffffff60);
  lVar1 = in_RDI[0x1d];
  this_06 = (SQCompiler *)in_RDI[0x1e];
  in_RDI[0x1d] = *(long *)(in_RDI[1] + 0x1c8);
  SVar2 = SQFuncState::GetStackSize((SQFuncState *)0x113b0d);
  in_RDI[0x1e] = SVar2;
  Expression(this_06);
  Expect((SQCompiler *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
         in_stack_ffffffffffffff60);
  SQFuncState::TopTarget((SQFuncState *)0x113b4c);
  SQFuncState::PushLocalVariable(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  SQFuncState::AddInstruction
            (in_stack_fffffffffffffef0,(SQOpcode)((ulong)in_stack_fffffffffffffee8 >> 0x20),
             in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,in_stack_fffffffffffffed0,
             in_stack_fffffffffffffec8);
  SQFuncState::PushLocalVariable(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  SQFuncState::AddInstruction
            (in_stack_fffffffffffffef0,(SQOpcode)((ulong)in_stack_fffffffffffffee8 >> 0x20),
             in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,in_stack_fffffffffffffed0,
             in_stack_fffffffffffffec8);
  this_02 = (sqvector<long_long> *)in_RDI[1];
  SQFuncState::CreateString(in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,(SQInteger)in_RDI);
  SQFuncState::PushLocalVariable(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  SQFuncState::AddInstruction
            (in_stack_fffffffffffffef0,(SQOpcode)((ulong)in_stack_fffffffffffffee8 >> 0x20),
             in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,in_stack_fffffffffffffed0,
             in_stack_fffffffffffffec8);
  funcstate = (SQFuncState *)SQFuncState::GetCurrentPos((SQFuncState *)0x113c70);
  SQFuncState::AddInstruction
            (in_stack_fffffffffffffef0,(SQOpcode)((ulong)in_stack_fffffffffffffee8 >> 0x20),
             in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,in_stack_fffffffffffffed0,
             in_stack_fffffffffffffec8);
  this_00 = (SQCompiler *)SQFuncState::GetCurrentPos((SQFuncState *)0x113cb1);
  SQFuncState::AddInstruction
            (in_stack_fffffffffffffef0,(SQOpcode)((ulong)in_stack_fffffffffffffee8 >> 0x20),
             in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,in_stack_fffffffffffffed0,
             in_stack_fffffffffffffec8);
  SVar3 = sqvector<long_long>::size((sqvector<long_long> *)(in_RDI[1] + 0x48));
  SVar4 = sqvector<long_long>::size((sqvector<long_long> *)(in_RDI[1] + 0x60));
  this_05 = (SQFuncState *)0x0;
  sqvector<long_long>::push_back(this_02,in_stack_fffffffffffffeb8);
  SVar2 = 0;
  sqvector<long_long>::push_back(this_02,in_stack_fffffffffffffeb8);
  Statement((SQCompiler *)this_01.pTable,(bool)in_stack_ffffffffffffffcf);
  this_03 = (SQCompiler *)in_RDI[1];
  SQFuncState::GetCurrentPos((SQFuncState *)0x113d8e);
  SQFuncState::AddInstruction
            (in_stack_fffffffffffffef0,(SQOpcode)((ulong)in_stack_fffffffffffffee8 >> 0x20),
             in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,(SQInteger)this_03,
             (SQInteger)funcstate);
  funcstate_00 = (SQFuncState *)in_RDI[1];
  pSVar10 = this_00;
  SQFuncState::GetCurrentPos((SQFuncState *)0x113dd5);
  SQFuncState::SetInstructionParam
            (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,(SQInteger)this_00,
             (SQInteger)funcstate_00);
  lVar9 = in_RDI[1];
  this_04 = (SQFuncState *)((long)&pSVar10->_token + 1);
  SQFuncState::GetCurrentPos((SQFuncState *)0x113e16);
  SQFuncState::SetInstructionParam(this_04,lVar9,(SQInteger)this_00,(SQInteger)funcstate_00);
  _op = (SQOpcode)((ulong)lVar9 >> 0x20);
  SVar5 = sqvector<long_long>::size((sqvector<long_long> *)(in_RDI[1] + 0x48));
  SVar6 = sqvector<long_long>::size((sqvector<long_long> *)(in_RDI[1] + 0x60));
  if (0 < (long)(SVar6 - SVar4)) {
    ResolveContinues(this_03,funcstate,(SQInteger)this_02,(SQInteger)in_stack_fffffffffffffeb8);
  }
  if (0 < (long)(SVar5 - SVar3)) {
    ResolveBreaks(this_00,funcstate_00,(SQInteger)this_03);
  }
  sqvector<long_long>::pop_back((sqvector<long_long> *)(in_RDI[1] + 0x170));
  sqvector<long_long>::pop_back((sqvector<long_long> *)(in_RDI[1] + 0x188));
  SQFuncState::PopTarget((SQFuncState *)this_03);
  lVar9 = *(long *)(in_RDI[1] + 0x1c8);
  SVar7 = SQFuncState::GetStackSize((SQFuncState *)0x113f02);
  if ((SVar7 != in_RDI[0x1e]) &&
     (SQFuncState::SetStackSize(this_05,SVar2), lVar9 != *(long *)(in_RDI[1] + 0x1c8))) {
    SQFuncState::AddInstruction
              (this_04,_op,(SQInteger)this_00,(SQInteger)funcstate_00,(SQInteger)this_03,
               (SQInteger)funcstate);
  }
  in_RDI[0x1d] = lVar1;
  in_RDI[0x1e] = (long)this_06;
  return;
}

Assistant:

void ForEachStatement()
    {
        SQObject idxname, valname;
        Lex(); Expect(_SC('(')); valname = Expect(TK_IDENTIFIER);
        if(_token == _SC(',')) {
            idxname = valname;
            Lex(); valname = Expect(TK_IDENTIFIER);
        }
        else{
            idxname = _fs->CreateString(_SC("@INDEX@"));
        }
        Expect(TK_IN);

        //save the stack size
        BEGIN_SCOPE();
        //put the table in the stack(evaluate the table expression)
        Expression(); Expect(_SC(')'));
        SQInteger container = _fs->TopTarget();
        //push the index local var
        SQInteger indexpos = _fs->PushLocalVariable(idxname);
        _fs->AddInstruction(_OP_LOADNULLS, indexpos,1);
        //push the value local var
        SQInteger valuepos = _fs->PushLocalVariable(valname);
        _fs->AddInstruction(_OP_LOADNULLS, valuepos,1);
        //push reference index
        SQInteger itrpos = _fs->PushLocalVariable(_fs->CreateString(_SC("@ITERATOR@"))); //use invalid id to make it inaccessible
        _fs->AddInstruction(_OP_LOADNULLS, itrpos,1);
        SQInteger jmppos = _fs->GetCurrentPos();
        _fs->AddInstruction(_OP_FOREACH, container, 0, indexpos);
        SQInteger foreachpos = _fs->GetCurrentPos();
        _fs->AddInstruction(_OP_POSTFOREACH, container, 0, indexpos);
        //generate the statement code
        BEGIN_BREAKBLE_BLOCK()
        Statement();
        _fs->AddInstruction(_OP_JMP, 0, jmppos - _fs->GetCurrentPos() - 1);
        _fs->SetInstructionParam(foreachpos, 1, _fs->GetCurrentPos() - foreachpos);
        _fs->SetInstructionParam(foreachpos + 1, 1, _fs->GetCurrentPos() - foreachpos);
        END_BREAKBLE_BLOCK(foreachpos - 1);
        //restore the local variable stack(remove index,val and ref idx)
        _fs->PopTarget();
        END_SCOPE();
    }